

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool verbose;
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  invalid_argument *this;
  char *__s2;
  char *__s1;
  uint uVar4;
  double dVar5;
  float local_48;
  long local_38;
  
  if (argc < 2) {
    usageMessage((ostream *)&std::cerr,*argv,false);
  }
  else {
    local_48 = 0.0;
    local_38 = 100;
    __s2 = (char *)0x0;
    verbose = false;
    pcVar2 = (char *)0x0;
    for (uVar4 = 1; (int)uVar4 < argc; uVar4 = uVar4 + iVar1) {
      __s1 = argv[uVar4];
      if (*__s1 == '-') {
        if ((__s1[1] == 'w') && (__s1[2] == '\0')) {
          if (argc + -2 < (int)uVar4) {
            this = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(this,"Missing width for -w argument");
            goto LAB_00102754;
          }
          local_38 = strtol(argv[(ulong)uVar4 + 1],(char **)0x0,0);
          iVar1 = 2;
          if ((int)local_38 < 1) {
            this = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(this,"preview width must be greater than zero");
            goto LAB_00102754;
          }
        }
        else {
          if ((__s1[1] != 'e') || (__s1[2] != '\0')) {
            if ((__s1[1] != 'v') || (__s1[2] != '\0')) {
              if ((__s1[1] == 'h') && (__s1[2] == '\0')) goto LAB_001025e9;
              goto LAB_00102521;
            }
            verbose = true;
            __s1 = __s2;
            goto LAB_0010255a;
          }
          if (argc + -2 < (int)uVar4) {
            this = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(this,"missing exposure for -e argument");
            goto LAB_00102754;
          }
          dVar5 = strtod(argv[(ulong)uVar4 + 1],(char **)0x0);
          local_48 = (float)dVar5;
          iVar1 = 2;
        }
      }
      else {
LAB_00102521:
        iVar1 = strcmp(__s1,"--help");
        if (iVar1 == 0) {
LAB_001025e9:
          usageMessage((ostream *)&std::cout,"exrmakepreview",true);
          return 0;
        }
        iVar1 = strcmp(__s1,"--version");
        if (iVar1 == 0) {
          pcVar2 = (char *)Imf_3_4::getLibraryVersion();
          poVar3 = std::operator<<((ostream *)&std::cout,"exrmakepreview (OpenEXR) ");
          std::operator<<(poVar3,"3.4.0");
          iVar1 = strcmp(pcVar2,"3.4.0");
          if (iVar1 != 0) {
            poVar3 = std::operator<<((ostream *)&std::cout,"(OpenEXR version ");
            poVar3 = std::operator<<(poVar3,pcVar2);
            std::operator<<(poVar3,")");
          }
          poVar3 = std::operator<<((ostream *)&std::cout," https://openexr.com");
          std::endl<char,std::char_traits<char>>(poVar3);
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "Copyright (c) Contributors to the OpenEXR Project");
          std::endl<char,std::char_traits<char>>(poVar3);
          poVar3 = std::operator<<((ostream *)&std::cout,"License BSD-3-Clause");
          std::endl<char,std::char_traits<char>>(poVar3);
          return 0;
        }
        if (pcVar2 == (char *)0x0) {
          pcVar2 = __s1;
          __s1 = __s2;
        }
LAB_0010255a:
        iVar1 = 1;
        __s2 = __s1;
      }
    }
    if (__s2 != (char *)0x0 && pcVar2 != (char *)0x0) {
      iVar1 = strcmp(pcVar2,__s2);
      if (iVar1 != 0) {
        makePreview(pcVar2,__s2,(int)local_38,local_48,verbose);
        return 0;
      }
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Input and output cannot be the same file");
LAB_00102754:
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    usageMessage((ostream *)&std::cerr,*argv,false);
  }
  return -1;
}

Assistant:

int
main (int argc, char** argv)
{
    const char* inFile       = 0;
    const char* outFile      = 0;
    int         previewWidth = 100;
    float       exposure     = 0;
    bool        verbose      = false;

    //
    // Parse the command line.
    //

    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return -1;
    }

    try
    {
        int i = 1;

        while (i < argc)
        {
            if (!strcmp (argv[i], "-w"))
            {
                //
                // Set preview image width
                //

                if (i > argc - 2)
                    throw invalid_argument ("Missing width for -w argument");

                previewWidth = strtol (argv[i + 1], 0, 0);
                if (previewWidth <= 0)
                    throw invalid_argument (
                        "preview width must be greater than zero");

                i += 2;
            }
            else if (!strcmp (argv[i], "-e"))
            {
                //
                // Set exposure
                //

                if (i > argc - 2)
                    throw invalid_argument ("missing exposure for -e argument");

                exposure = strtod (argv[i + 1], 0);

                i += 2;
            }
            else if (!strcmp (argv[i], "-v"))
            {
                //
                // Verbose mode
                //

                verbose = true;
                i += 1;
            }
            else if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
            {
                //
                // Print help message
                //

                usageMessage (cout, "exrmakepreview", true);
                return 0;
            }
            else if (!strcmp (argv[i], "--version"))
            {
                const char* libraryVersion = getLibraryVersion ();

                cout << "exrmakepreview (OpenEXR) " << OPENEXR_VERSION_STRING;
                if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                    cout << "(OpenEXR version " << libraryVersion << ")";
                cout << " https://openexr.com" << endl;
                cout << "Copyright (c) Contributors to the OpenEXR Project"
                     << endl;
                cout << "License BSD-3-Clause" << endl;
                return 0;
            }
            else
            {
                //
                // Image file name
                //

                if (inFile == 0)
                    inFile = argv[i];
                else
                    outFile = argv[i];

                i += 1;
            }
        }

        if (inFile == 0 || outFile == 0)
        {
            usageMessage (cerr, argv[0], false);
            return -1;
        }

        if (!strcmp (inFile, outFile))
            throw invalid_argument ("Input and output cannot be the same file");

        if (previewWidth <= 0)
            throw invalid_argument (
                "Preview image width must be greater than zero");

        //
        // Load inFile, add a preview image, and save the result in outFile.
        //

        makePreview (inFile, outFile, previewWidth, exposure, verbose);
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return 1;
    }

    return 0;
}